

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O3

ogt_vox_transform *
ogt_vox_transform_multiply
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_transform *a,ogt_vox_transform *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  fVar1 = a->m00;
  fVar2 = a->m01;
  fVar3 = a->m02;
  fVar4 = a->m03;
  fVar5 = b->m00;
  fVar6 = b->m01;
  fVar7 = b->m02;
  fVar8 = b->m03;
  fVar9 = b->m10;
  fVar10 = b->m11;
  fVar11 = b->m12;
  fVar12 = b->m13;
  fVar13 = b->m20;
  fVar14 = b->m21;
  fVar15 = b->m22;
  fVar16 = b->m23;
  fVar17 = b->m30;
  fVar18 = b->m31;
  fVar19 = b->m32;
  fVar20 = b->m33;
  __return_storage_ptr__->m00 = fVar4 * fVar17 + fVar3 * fVar13 + fVar1 * fVar5 + fVar2 * fVar9;
  __return_storage_ptr__->m01 = fVar4 * fVar18 + fVar3 * fVar14 + fVar1 * fVar6 + fVar2 * fVar10;
  __return_storage_ptr__->m02 = fVar4 * fVar19 + fVar3 * fVar15 + fVar1 * fVar7 + fVar2 * fVar11;
  __return_storage_ptr__->m03 = fVar4 * fVar20 + fVar3 * fVar16 + fVar1 * fVar8 + fVar2 * fVar12;
  fVar1 = a->m10;
  fVar2 = a->m11;
  fVar3 = a->m12;
  fVar4 = a->m13;
  __return_storage_ptr__->m10 = fVar4 * fVar17 + fVar3 * fVar13 + fVar1 * fVar5 + fVar2 * fVar9;
  __return_storage_ptr__->m11 = fVar4 * fVar18 + fVar3 * fVar14 + fVar1 * fVar6 + fVar2 * fVar10;
  __return_storage_ptr__->m12 = fVar4 * fVar19 + fVar3 * fVar15 + fVar1 * fVar7 + fVar2 * fVar11;
  __return_storage_ptr__->m13 = fVar4 * fVar20 + fVar3 * fVar16 + fVar1 * fVar8 + fVar2 * fVar12;
  fVar1 = a->m20;
  fVar2 = a->m21;
  fVar3 = a->m22;
  fVar4 = a->m23;
  __return_storage_ptr__->m20 = fVar4 * fVar17 + fVar3 * fVar13 + fVar1 * fVar5 + fVar2 * fVar9;
  __return_storage_ptr__->m21 = fVar4 * fVar18 + fVar3 * fVar14 + fVar1 * fVar6 + fVar2 * fVar10;
  __return_storage_ptr__->m22 = fVar4 * fVar19 + fVar3 * fVar15 + fVar1 * fVar7 + fVar2 * fVar11;
  __return_storage_ptr__->m23 = fVar4 * fVar20 + fVar3 * fVar16 + fVar1 * fVar8 + fVar2 * fVar12;
  fVar4 = a->m30;
  fVar1 = a->m31;
  fVar2 = a->m32;
  fVar3 = a->m33;
  __return_storage_ptr__->m30 = fVar3 * fVar17 + fVar2 * fVar13 + fVar4 * fVar5 + fVar1 * fVar9;
  __return_storage_ptr__->m31 = fVar3 * fVar18 + fVar2 * fVar14 + fVar4 * fVar6 + fVar1 * fVar10;
  __return_storage_ptr__->m32 = fVar3 * fVar19 + fVar2 * fVar15 + fVar4 * fVar7 + fVar1 * fVar11;
  __return_storage_ptr__->m33 = fVar3 * fVar20 + fVar2 * fVar16 + fVar4 * fVar8 + fVar1 * fVar12;
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_transform_multiply(const ogt_vox_transform& a, const ogt_vox_transform& b) {
        ogt_vox_transform r;
        r.m00 = (a.m00 * b.m00) + (a.m01 * b.m10) + (a.m02 * b.m20) + (a.m03 * b.m30);
        r.m01 = (a.m00 * b.m01) + (a.m01 * b.m11) + (a.m02 * b.m21) + (a.m03 * b.m31);
        r.m02 = (a.m00 * b.m02) + (a.m01 * b.m12) + (a.m02 * b.m22) + (a.m03 * b.m32);
        r.m03 = (a.m00 * b.m03) + (a.m01 * b.m13) + (a.m02 * b.m23) + (a.m03 * b.m33);
        r.m10 = (a.m10 * b.m00) + (a.m11 * b.m10) + (a.m12 * b.m20) + (a.m13 * b.m30);
        r.m11 = (a.m10 * b.m01) + (a.m11 * b.m11) + (a.m12 * b.m21) + (a.m13 * b.m31);
        r.m12 = (a.m10 * b.m02) + (a.m11 * b.m12) + (a.m12 * b.m22) + (a.m13 * b.m32);
        r.m13 = (a.m10 * b.m03) + (a.m11 * b.m13) + (a.m12 * b.m23) + (a.m13 * b.m33);
        r.m20 = (a.m20 * b.m00) + (a.m21 * b.m10) + (a.m22 * b.m20) + (a.m23 * b.m30);
        r.m21 = (a.m20 * b.m01) + (a.m21 * b.m11) + (a.m22 * b.m21) + (a.m23 * b.m31);
        r.m22 = (a.m20 * b.m02) + (a.m21 * b.m12) + (a.m22 * b.m22) + (a.m23 * b.m32);
        r.m23 = (a.m20 * b.m03) + (a.m21 * b.m13) + (a.m22 * b.m23) + (a.m23 * b.m33);
        r.m30 = (a.m30 * b.m00) + (a.m31 * b.m10) + (a.m32 * b.m20) + (a.m33 * b.m30);
        r.m31 = (a.m30 * b.m01) + (a.m31 * b.m11) + (a.m32 * b.m21) + (a.m33 * b.m31);
        r.m32 = (a.m30 * b.m02) + (a.m31 * b.m12) + (a.m32 * b.m22) + (a.m33 * b.m32);
        r.m33 = (a.m30 * b.m03) + (a.m31 * b.m13) + (a.m32 * b.m23) + (a.m33 * b.m33);
        return r;
    }